

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O1

handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
::lock(handle *__return_storage_ptr__,
      shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
      *this)

{
  bool bVar1;
  unique_lock<std::shared_mutex> local_20;
  
  bVar1 = this->enabled;
  if (bVar1 == true) {
    __return_storage_ptr__->data = &this->m_obj;
    (__return_storage_ptr__->m_handle_lock)._M_device = &this->m_mutex;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&__return_storage_ptr__->m_handle_lock);
    (__return_storage_ptr__->m_handle_lock)._M_owns = true;
  }
  else {
    __return_storage_ptr__->data = &this->m_obj;
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_20._M_device = (mutex_type *)0x0;
    local_20._M_owns = false;
  }
  if (bVar1 == false) {
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}